

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O3

Cut_Cut_t * Cut_CutMergeLists(Cut_Cut_t *pList1,Cut_Cut_t *pList2)

{
  int iVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t **ppCVar3;
  bool bVar4;
  Cut_Cut_t *pList;
  Cut_Cut_t *local_20;
  
  local_20 = (Cut_Cut_t *)0x0;
  bVar4 = pList1 != (Cut_Cut_t *)0x0;
  ppCVar3 = &local_20;
  if (pList2 != (Cut_Cut_t *)0x0 && bVar4) {
    do {
      iVar1 = Cut_CutCompare(pList1,pList2);
      if (iVar1 < 0) {
        pCVar2 = pList1;
        pList1 = pList1->pNext;
      }
      else {
        pCVar2 = pList2;
        pList2 = pList2->pNext;
      }
      *ppCVar3 = pCVar2;
      ppCVar3 = &pCVar2->pNext;
      bVar4 = pList1 != (Cut_Cut_t *)0x0;
    } while ((bVar4) && (pList2 != (Cut_Cut_t *)0x0));
  }
  if (!bVar4) {
    pList1 = pList2;
  }
  *ppCVar3 = pList1;
  return local_20;
}

Assistant:

Cut_Cut_t * Cut_CutMergeLists( Cut_Cut_t * pList1, Cut_Cut_t * pList2 )
{
    Cut_Cut_t * pList = NULL, ** ppTail = &pList;
    Cut_Cut_t * pCut;
    while ( pList1 && pList2 )
    {
        if ( Cut_CutCompare(pList1, pList2) < 0 )
        {
            pCut = pList1;
            pList1 = pList1->pNext;
        }
        else
        {
            pCut = pList2;
            pList2 = pList2->pNext;
        }
        *ppTail = pCut;
        ppTail = &pCut->pNext;
    }
    *ppTail = pList1? pList1: pList2;
    return pList;
}